

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O0

bool dxil_spv::emit_cbuffer_load_legacy_instruction(Impl *impl,CallInst *instruction)

{
  CallInst *pCVar1;
  RawVecSize op_00;
  undefined8 uVar2;
  Builder *pBVar3;
  CallInst *pCVar4;
  bool bVar5;
  TypeID TVar6;
  Id IVar7;
  Value *pVVar8;
  mapped_type *meta_00;
  Type *pTVar9;
  void *pvVar10;
  mapped_type *pmVar11;
  Operation *pOVar12;
  Operation *this;
  Id local_110c;
  Operation *cast_op;
  Operation *op;
  Id uint_vector_type_id;
  Operation *load_op;
  Id IStack_10a8;
  bool need_bitcast;
  Id local_10a4;
  initializer_list<unsigned_int> local_10a0;
  Operation *local_1090;
  Operation *access_chain_op;
  Id local_1080;
  Id vector_type_id;
  Id element_type_id;
  Id vec4_index;
  RawType raw_type;
  uint vecsize;
  uint bits;
  uint scalar_alignment;
  RawWidth alias_width;
  RawVecSize alias_vecsize;
  Id physical_type_id;
  Op value_cast_op;
  Type *result_component_type;
  char local_1048 [8];
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  Type *result_type;
  mapped_type *meta;
  Builder *pBStack_28;
  Id ptr_id;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  
  builder = (Builder *)instruction;
  instruction_local = (CallInst *)impl;
  pBStack_28 = Converter::Impl::builder(impl);
  pCVar4 = instruction_local;
  pVVar8 = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
  meta._4_4_ = Converter::Impl::get_id_for_value((Impl *)pCVar4,pVVar8,0);
  if (meta._4_4_ == 0) {
    impl_local._7_1_ = false;
  }
  else if (meta._4_4_ ==
           (Id)instruction_local[0xf].super_Instruction.attachments._M_h._M_bucket_count) {
    impl_local._7_1_ =
         emit_cbuffer_load_root_constant((Impl *)instruction_local,(CallInst *)builder);
  }
  else {
    meta_00 = std::
              unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
              ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                            *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                               _M_rehash_policy._M_next_resize,(key_type *)((long)&meta + 4));
    pTVar9 = LLVMBC::Value::getType((Value *)builder);
    TVar6 = LLVMBC::Type::getTypeID(pTVar9);
    if (TVar6 == StructTyID) {
      emit_buffer_synchronization_validation((Impl *)instruction_local,(CallInst *)builder,Load);
      pCVar4 = instruction_local;
      pBVar3 = builder;
      if (meta_00->storage == StorageClassPhysicalStorageBuffer) {
        impl_local._7_1_ =
             emit_cbuffer_load_physical_pointer((Impl *)instruction_local,(CallInst *)builder);
      }
      else if (meta_00->storage == StorageClassShaderRecordBufferKHR) {
        pCVar1 = instruction_local + 0x10;
        result_component_type = (Type *)LLVMBC::Instruction::getOperand((Instruction *)builder,1);
        pmVar11 = std::
                  unordered_map<const_LLVMBC::Value_*,_unsigned_int,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>_>
                  ::operator[]((unordered_map<const_LLVMBC::Value_*,_unsigned_int,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>_>
                                *)&(pCVar1->super_Instruction).attachments._M_h._M_rehash_policy,
                               (key_type *)&result_component_type);
        impl_local._7_1_ =
             emit_cbuffer_load_shader_record((Impl *)pCVar4,(CallInst *)pBVar3,*pmVar11);
      }
      else {
        _physical_type_id = LLVMBC::Type::getStructElementType(pTVar9,0);
        alias_vecsize = V1;
        alias_width = B8;
        get_physical_load_store_cast_info
                  ((Impl *)instruction_local,_physical_type_id,&alias_width,&alias_vecsize);
        vecsize = get_type_scalar_alignment((Impl *)instruction_local,_physical_type_id);
        if (vecsize == 8) {
          bits = 3;
          scalar_alignment = 1;
        }
        else {
          bits = 2;
          scalar_alignment = 3;
        }
        raw_type = raw_width_to_bits(bits);
        vec4_index = raw_vecsize_to_vecsize(scalar_alignment);
        TVar6 = LLVMBC::Type::getTypeID(_physical_type_id);
        element_type_id = (Id)(TVar6 != IntegerTyID || vecsize != 8);
        meta._4_4_ = get_buffer_alias_handle
                               ((Impl *)instruction_local,meta_00,meta._4_4_,element_type_id,bits,
                                scalar_alignment);
        pCVar4 = instruction_local;
        pVVar8 = LLVMBC::Instruction::getOperand((Instruction *)builder,2);
        vector_type_id = Converter::Impl::get_id_for_value((Impl *)pCVar4,pVVar8,0);
        if (element_type_id == 0) {
          local_110c = spv::Builder::makeUintType(pBStack_28,raw_type);
        }
        else {
          local_110c = spv::Builder::makeFloatType(pBStack_28,raw_type);
        }
        local_1080 = local_110c;
        access_chain_op._4_4_ = spv::Builder::makeVectorType(pBStack_28,local_110c,vec4_index);
        pCVar4 = instruction_local;
        IVar7 = spv::Builder::makePointer(pBStack_28,meta_00->storage,access_chain_op._4_4_);
        pOVar12 = Converter::Impl::allocate((Impl *)pCVar4,OpAccessChain,IVar7);
        load_op._4_4_ = meta._4_4_;
        local_1090 = pOVar12;
        IStack_10a8 = spv::Builder::makeUintConstant(pBStack_28,0,false);
        local_10a4 = vector_type_id;
        local_10a0._M_array = (iterator)((long)&load_op + 4);
        local_10a0._M_len = 3;
        Operation::add_ids(pOVar12,&local_10a0);
        Converter::Impl::add((Impl *)instruction_local,local_1090,false);
        if ((meta_00->non_uniform & 1U) != 0) {
          spv::Builder::addDecoration(pBStack_28,local_1090->id,DecorationNonUniform,-1);
        }
        load_op._3_1_ = 0;
        pTVar9 = LLVMBC::Type::getStructElementType(pTVar9,0);
        TVar6 = LLVMBC::Type::getTypeID(pTVar9);
        if ((TVar6 == IntegerTyID) && (vecsize < 8)) {
          load_op._3_1_ = 1;
        }
        pOVar12 = Converter::Impl::allocate
                            ((Impl *)instruction_local,OpLoad,(Value *)builder,access_chain_op._4_4_
                            );
        Operation::add_id(pOVar12,local_1090->id);
        Converter::Impl::add((Impl *)instruction_local,pOVar12,false);
        pBVar3 = pBStack_28;
        if (vecsize == 2) {
          bVar5 = build_bitcast_32x4_to_16x8_composite
                            ((Impl *)instruction_local,(CallInst *)builder,pOVar12->id);
          if (!bVar5) {
            return false;
          }
        }
        else if ((load_op._3_1_ & 1) != 0) {
          IVar7 = spv::Builder::makeUintType(pBStack_28,raw_type);
          IVar7 = spv::Builder::makeVectorType(pBVar3,IVar7,vec4_index);
          this = Converter::Impl::allocate((Impl *)instruction_local,OpBitcast,IVar7);
          Operation::add_id(this,pOVar12->id);
          Converter::Impl::add((Impl *)instruction_local,this,false);
          Converter::Impl::rewrite_value((Impl *)instruction_local,(Value *)builder,this->id);
        }
        pCVar4 = instruction_local;
        pBVar3 = pBStack_28;
        op_00 = alias_vecsize;
        if (alias_vecsize != V1) {
          IVar7 = Converter::Impl::get_type_id((Impl *)instruction_local,_physical_type_id,0);
          IVar7 = spv::Builder::makeVectorType(pBVar3,IVar7,vec4_index);
          pOVar12 = Converter::Impl::allocate((Impl *)pCVar4,op_00,IVar7);
          IVar7 = Converter::Impl::get_id_for_value((Impl *)instruction_local,(Value *)builder,0);
          Operation::add_id(pOVar12,IVar7);
          Converter::Impl::add((Impl *)instruction_local,pOVar12,false);
          Converter::Impl::rewrite_value((Impl *)instruction_local,(Value *)builder,pOVar12->id);
        }
        build_exploded_composite_from_vector((Impl *)instruction_local,(Instruction *)builder,4);
        impl_local._7_1_ = true;
      }
    }
    else {
      buffer._4088_8_ = get_thread_log_callback();
      if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
        fprintf(_stderr,"[ERROR]: CBufferLoadLegacy: return type must be struct.\n");
        fflush(_stderr);
      }
      else {
        snprintf(local_1048,0x1000,"CBufferLoadLegacy: return type must be struct.\n");
        uVar2 = buffer._4088_8_;
        pvVar10 = get_thread_log_callback_userdata();
        (*(code *)uVar2)(pvVar10,2,local_1048);
      }
      impl_local._7_1_ = false;
    }
  }
  return impl_local._7_1_;
}

Assistant:

bool emit_cbuffer_load_legacy_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	// This function returns a struct, but ignore that, and just return a vec4 for now.
	// extractvalue is used to pull out components and that works for vectors as well.
	spv::Id ptr_id = impl.get_id_for_value(instruction->getOperand(1));
	if (!ptr_id)
		return false;

	if (ptr_id == impl.root_constant_id)
	{
		return emit_cbuffer_load_root_constant(impl, instruction);
	}
	else
	{
		auto &meta = impl.handle_to_resource_meta[ptr_id];

		auto *result_type = instruction->getType();

		if (result_type->getTypeID() != llvm::Type::TypeID::StructTyID)
		{
			LOGE("CBufferLoadLegacy: return type must be struct.\n");
			return false;
		}

		emit_buffer_synchronization_validation(impl, instruction, BDAOperation::Load);

		if (meta.storage == spv::StorageClassPhysicalStorageBuffer)
		{
			return emit_cbuffer_load_physical_pointer(impl, instruction);
		}
		else if (meta.storage == spv::StorageClassShaderRecordBufferKHR)
		{
			return emit_cbuffer_load_shader_record(impl, instruction,
			                                       impl.handle_to_root_member_offset[instruction->getOperand(1)]);
		}

		// Handle min16float where we want FP16 value, but FP32 physical.
		auto *result_component_type = result_type->getStructElementType(0);
		spv::Op value_cast_op = spv::OpNop;
		spv::Id physical_type_id = 0;
		get_physical_load_store_cast_info(impl, result_component_type, physical_type_id, value_cast_op);

		RawVecSize alias_vecsize;
		RawWidth alias_width;
		unsigned scalar_alignment = get_type_scalar_alignment(impl, result_component_type);
		unsigned bits, vecsize;

		if (scalar_alignment == 8)
		{
			alias_width = RawWidth::B64;
			alias_vecsize = RawVecSize::V2;
		}
		else
		{
			alias_width = RawWidth::B32;
			alias_vecsize = RawVecSize::V4;
		}

		bits = raw_width_to_bits(alias_width);
		vecsize = raw_vecsize_to_vecsize(alias_vecsize);

		RawType raw_type = result_component_type->getTypeID() == llvm::Type::TypeID::IntegerTyID &&
		                   scalar_alignment == 8 ? RawType::Integer : RawType::Float;

		ptr_id = get_buffer_alias_handle(impl, meta, ptr_id, raw_type, alias_width, alias_vecsize);

		spv::Id vec4_index = impl.get_id_for_value(instruction->getOperand(2));

		spv::Id element_type_id = raw_type == RawType::Integer ?
		                          builder.makeUintType(bits) : builder.makeFloatType(bits);

		spv::Id vector_type_id = builder.makeVectorType(element_type_id, vecsize);
		Operation *access_chain_op = impl.allocate(spv::OpAccessChain, builder.makePointer(meta.storage, vector_type_id));
		access_chain_op->add_ids({ ptr_id, builder.makeUintConstant(0), vec4_index });
		impl.add(access_chain_op);

		if (meta.non_uniform)
			builder.addDecoration(access_chain_op->id, spv::DecorationNonUniformEXT);

		bool need_bitcast = false;
		if (result_type->getStructElementType(0)->getTypeID() == llvm::Type::TypeID::IntegerTyID && scalar_alignment < 8)
			need_bitcast = true;

		Operation *load_op = impl.allocate(spv::OpLoad, instruction, vector_type_id);
		load_op->add_id(access_chain_op->id);
		impl.add(load_op);

		if (scalar_alignment == 2)
		{
			// Special case, need to bitcast and build a struct with 8 elements instead.
			if (!build_bitcast_32x4_to_16x8_composite(impl, instruction, load_op->id))
				return false;
		}
		else if (need_bitcast)
		{
			spv::Id uint_vector_type_id = builder.makeVectorType(builder.makeUintType(bits), vecsize);
			Operation *op = impl.allocate(spv::OpBitcast, uint_vector_type_id);

			op->add_id(load_op->id);
			impl.add(op);
			impl.rewrite_value(instruction, op->id);
		}

		// If we have min-precision loads, we might have to truncate here.
		if (value_cast_op != spv::OpNop)
		{
			auto *cast_op = impl.allocate(value_cast_op, builder.makeVectorType(impl.get_type_id(result_component_type), vecsize));
			cast_op->add_id(impl.get_id_for_value(instruction));
			impl.add(cast_op);
			impl.rewrite_value(instruction, cast_op->id);
		}

		build_exploded_composite_from_vector(impl, instruction, 4);
	}

	return true;
}